

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* default_search_paths_abi_cxx11_(void)

{
  char **ppcVar1;
  int iVar2;
  ssize_t sVar3;
  size_type sVar4;
  size_type __n;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  allocator<char> local_a1;
  vector<char,_std::allocator<char>_> buf;
  Dl_info rInfo;
  string exepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  exepath._M_dataplus._M_p = (pointer)&exepath.field_2;
  exepath._M_string_length = 0;
  exepath.field_2._M_local_buf[0] = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&buf,0x800,(allocator_type *)&rInfo);
  sVar3 = readlink("/proc/self/exe",
                   buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
  ppcVar1 = &rInfo.dli_sname;
  if (-1 < sVar3) {
    rInfo.dli_fname = (char *)ppcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&rInfo,
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + sVar3);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&exepath,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rInfo)
    ;
    std::__cxx11::string::~string((string *)&rInfo);
  }
  if (exepath._M_string_length == 0) {
    sVar3 = readlink("/proc/curproc/file",
                     buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
    if (-1 < sVar3) {
      rInfo.dli_fname = (char *)ppcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&rInfo,
                 buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                 ._M_start,
                 buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                 ._M_start + sVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&exepath,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &rInfo);
      std::__cxx11::string::~string((string *)&rInfo);
    }
    if (exepath._M_string_length == 0) {
      sVar3 = readlink("/proc/self/path/a.out",
                       buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
      if (-1 < sVar3) {
        rInfo.dli_fname = (char *)ppcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&rInfo,
                   buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + sVar3);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&exepath,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &rInfo);
        std::__cxx11::string::~string((string *)&rInfo);
      }
      if (exepath._M_string_length == 0) {
        rInfo.dli_sname = (char *)0x0;
        rInfo.dli_saddr = (void *)0x0;
        rInfo.dli_fname = (char *)0x0;
        rInfo.dli_fbase = (void *)0x0;
        iVar2 = dladdr(default_search_paths_abi_cxx11_,&rInfo);
        if (rInfo.dli_fname == (char *)0x0 || iVar2 == 0) goto LAB_00333ca2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,rInfo.dli_fname,&local_a1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&exepath,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
    }
  }
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (&exepath,'/',0xffffffffffffffff);
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                  (&exepath,'/',sVar4 - 1);
  if (sVar4 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rInfo,&exepath,
               0,sVar4 + 1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rInfo);
    std::__cxx11::string::~string((string *)&rInfo);
  }
  if (__n != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_40,&exepath,0,__n);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rInfo,
                   &local_40,"/lib/chaiscript/");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rInfo);
    std::__cxx11::string::~string((string *)&rInfo);
    std::__cxx11::string::~string((string *)&local_40);
  }
LAB_00333ca2:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&exepath);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> default_search_paths() {
  std::vector<std::string> paths;

#ifndef CHAISCRIPT_NO_DYNLOAD
#ifdef CHAISCRIPT_WINDOWS // force no unicode
  CHAR path[4096];
  int size = GetModuleFileNameA(nullptr, path, sizeof(path) - 1);

  std::string exepath(path, size);

  size_t lastslash = exepath.rfind('\\');
  size_t secondtolastslash = exepath.rfind('\\', lastslash - 1);
  if (lastslash != std::string::npos) {
    paths.push_back(exepath.substr(0, lastslash));
  }

  if (secondtolastslash != std::string::npos) {
    return {exepath.substr(0, secondtolastslash) + "\\lib\\chaiscript\\"};
  }
#else

  std::string exepath;

  std::vector<char> buf(2048);
  ssize_t size = -1;

  if ((size = readlink("/proc/self/exe", &buf.front(), buf.size())) >= 0) {
    exepath = std::string(&buf.front(), static_cast<size_t>(size));
  }

  if (exepath.empty()) {
    if ((size = readlink("/proc/curproc/file", &buf.front(), buf.size())) >= 0) {
      exepath = std::string(&buf.front(), static_cast<size_t>(size));
    }
  }

  if (exepath.empty()) {
    if ((size = readlink("/proc/self/path/a.out", &buf.front(), buf.size())) >= 0) {
      exepath = std::string(&buf.front(), static_cast<size_t>(size));
    }
  }

  if (exepath.empty()) {
    Dl_info rInfo;
    memset(&rInfo, 0, sizeof(rInfo));
    if (dladdr(cast_module_symbol(&default_search_paths), &rInfo) == 0 || rInfo.dli_fname == nullptr) {
      return paths;
    }

    exepath = std::string(rInfo.dli_fname);
  }

  size_t lastslash = exepath.rfind('/');

  size_t secondtolastslash = exepath.rfind('/', lastslash - 1);
  if (lastslash != std::string::npos) {
    paths.push_back(exepath.substr(0, lastslash + 1));
  }

  if (secondtolastslash != std::string::npos) {
    paths.push_back(exepath.substr(0, secondtolastslash) + "/lib/chaiscript/");
  }
#endif
#endif // ifndef CHAISCRIPT_NO_DYNLOAD

  return paths;
}